

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

ssize_t __thiscall Bstrlib::CBString::read(CBString *this,int __fd,void *__buf,size_t __nbytes)

{
  bstring x;
  ssize_t sVar1;
  CBStringException *this_00;
  undefined4 in_register_00000034;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  if (0 < (this->super_tagbstring).mlen) {
    x = bread((bNread)CONCAT44(in_register_00000034,__fd),__buf);
    if (x == (bstring)0x0) {
      (this->super_tagbstring).slen = 0;
      sVar1 = -1;
    }
    else {
      operator=(this,x);
      bdestroy(x);
      sVar1 = 0;
    }
    return sVar1;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Write protection error",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::read (bNread readPtr, void * parm) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bread (readPtr, parm);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}